

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O0

float Abc_NtkDelayTrace(Abc_Ntk_t *pNtk,Abc_Obj_t *pOut,Abc_Obj_t *pIn,int fPrint)

{
  int iVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  Abc_Obj_t *pAVar4;
  Abc_Time_t *pAVar5;
  Vec_Int_t *vBest_00;
  Abc_Obj_t *pAVar6;
  char *pcVar7;
  char *pcVar8;
  size_t sVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  Abc_Obj_t *pFanin;
  int Length;
  int iFanin;
  int k;
  float SlackAdd;
  float Slack;
  Vec_Int_t *vBest;
  Vec_Ptr_t *vPath;
  int i;
  float tArrivalMax;
  Abc_Time_t *pTime;
  Vec_Ptr_t *vNodes;
  Abc_Obj_t *pDriver;
  Abc_Obj_t *pNode;
  Vec_Int_t *vSlacks;
  Abc_Obj_t *pAStack_20;
  int fPrint_local;
  Abc_Obj_t *pIn_local;
  Abc_Obj_t *pOut_local;
  Abc_Ntk_t *pNtk_local;
  
  pNode = (Abc_Obj_t *)0x0;
  vSlacks._4_4_ = fPrint;
  pAStack_20 = pIn;
  pIn_local = pOut;
  pOut_local = (Abc_Obj_t *)pNtk;
  iVar1 = Abc_NtkIsMappedLogic(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsMappedLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcTiming.c"
                  ,0x3e6,"float Abc_NtkDelayTrace(Abc_Ntk_t *, Abc_Obj_t *, Abc_Obj_t *, int)");
  }
  if ((pIn_local != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsCo(pIn_local), iVar1 == 0)) {
    __assert_fail("pOut == NULL || Abc_ObjIsCo(pOut)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcTiming.c"
                  ,999,"float Abc_NtkDelayTrace(Abc_Ntk_t *, Abc_Obj_t *, Abc_Obj_t *, int)");
  }
  if ((pAStack_20 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsCi(pAStack_20), iVar1 == 0)) {
    __assert_fail("pIn == NULL || Abc_ObjIsCi(pIn)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcTiming.c"
                  ,1000,"float Abc_NtkDelayTrace(Abc_Ntk_t *, Abc_Obj_t *, Abc_Obj_t *, int)");
  }
  if (((pIn_local != (Abc_Obj_t *)0x0) || (pAStack_20 != (Abc_Obj_t *)0x0)) || (vSlacks._4_4_ != 0))
  {
    pNode = (Abc_Obj_t *)Abc_NtkDelayTraceSlackStart((Abc_Ntk_t *)pOut_local);
  }
  Abc_NtkTimePrepare((Abc_Ntk_t *)pOut_local);
  pVVar3 = Abc_NtkDfs((Abc_Ntk_t *)pOut_local,1);
  for (vPath._0_4_ = 0; iVar1 = Vec_PtrSize(pVVar3), (int)vPath < iVar1;
      vPath._0_4_ = (int)vPath + 1) {
    pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(pVVar3,(int)vPath);
    Abc_NodeDelayTraceArrival(pAVar4,(Vec_Int_t *)pNode);
  }
  Vec_PtrFree(pVVar3);
  vPath._4_4_ = -1e+09;
  for (vPath._0_4_ = 0; iVar1 = Abc_NtkCoNum((Abc_Ntk_t *)pOut_local), (int)vPath < iVar1;
      vPath._0_4_ = (int)vPath + 1) {
    pAVar4 = Abc_NtkCo((Abc_Ntk_t *)pOut_local,(int)vPath);
    pAVar4 = Abc_ObjFanin0(pAVar4);
    pAVar5 = Abc_NodeArrival(pAVar4);
    fVar10 = Abc_MaxFloat(pAVar5->Fall,pAVar5->Rise);
    if (vPath._4_4_ < fVar10) {
      vPath._4_4_ = Abc_MaxFloat(pAVar5->Fall,pAVar5->Rise);
    }
  }
  if ((vSlacks._4_4_ != 0) && (pIn_local == (Abc_Obj_t *)0x0)) {
    for (vPath._0_4_ = 0; iVar1 = Abc_NtkCoNum((Abc_Ntk_t *)pOut_local), (int)vPath < iVar1;
        vPath._0_4_ = (int)vPath + 1) {
      pAVar4 = Abc_NtkCo((Abc_Ntk_t *)pOut_local,(int)vPath);
      pAVar6 = Abc_ObjFanin0(pAVar4);
      pAVar5 = Abc_NodeArrival(pAVar6);
      fVar10 = Abc_MaxFloat(pAVar5->Fall,pAVar5->Rise);
      if ((vPath._4_4_ == fVar10) && (!NAN(vPath._4_4_) && !NAN(fVar10))) {
        pIn_local = pAVar4;
      }
    }
    if (pIn_local == (Abc_Obj_t *)0x0) {
      __assert_fail("pOut != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcTiming.c"
                    ,0x409,"float Abc_NtkDelayTrace(Abc_Ntk_t *, Abc_Obj_t *, Abc_Obj_t *, int)");
    }
  }
  if (vSlacks._4_4_ != 0) {
    pVVar3 = Vec_PtrAlloc(100);
    iVar1 = Abc_NtkObjNumMax((Abc_Ntk_t *)pOut_local);
    vBest_00 = Vec_IntStartFull(iVar1);
    Abc_NtkIncrementTravId((Abc_Ntk_t *)pOut_local);
    pAVar4 = pNode;
    pAVar6 = Abc_ObjFanin0(pIn_local);
    iVar1 = Abc_NtkDelayTraceCritPath_rec((Vec_Int_t *)pAVar4,pAVar6,pAStack_20,vBest_00);
    if (iVar1 == 0) {
      if (pAStack_20 == (Abc_Obj_t *)0x0) {
        pcVar7 = Abc_ObjName(pIn_local);
        printf("The logic cone of PO \"%s\" has no primary inputs.\n",pcVar7);
      }
      else {
        pcVar7 = Abc_ObjName(pAStack_20);
        pcVar8 = Abc_ObjName(pIn_local);
        printf("There is no combinational path between PI \"%s\" and PO \"%s\".\n",pcVar7,pcVar8);
      }
    }
    else {
      pFanin._4_4_ = 0;
      fVar10 = Abc_NodeReadRequiredWorst(pIn_local);
      pAVar4 = Abc_ObjFanin0(pIn_local);
      fVar11 = Abc_NodeReadArrivalWorst(pAVar4);
      pAVar4 = pNode;
      pAVar6 = Abc_ObjFanin0(pIn_local);
      Abc_NtkDelayTraceCritPathCollect_rec((Vec_Int_t *)pAVar4,pAVar6,vBest_00,pVVar3);
      if (pAStack_20 == (Abc_Obj_t *)0x0) {
        pAStack_20 = (Abc_Obj_t *)Vec_PtrEntry(pVVar3,0);
      }
      for (vPath._0_4_ = 0; iVar1 = Vec_PtrSize(pVVar3), (int)vPath < iVar1;
          vPath._0_4_ = (int)vPath + 1) {
        pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(pVVar3,(int)vPath);
        iVar1 = Abc_ObjIsNode(pAVar4);
        if (iVar1 != 0) {
          pcVar7 = Mio_GateReadName((Mio_Gate_t *)(pAVar4->field_5).pData);
          sVar9 = strlen(pcVar7);
          pFanin._4_4_ = Abc_MaxInt(pFanin._4_4_,(int)sVar9);
        }
      }
      Abc_NtkLevel((Abc_Ntk_t *)pOut_local);
      pcVar7 = Abc_ObjName(pAStack_20);
      pcVar8 = Abc_ObjName(pIn_local);
      printf("Critical path from PI \"%s\" to PO \"%s\":\n",pcVar7,pcVar8);
      for (vPath._0_4_ = 0; iVar1 = Vec_PtrSize(pVVar3), (int)vPath < iVar1;
          vPath._0_4_ = (int)vPath + 1) {
        pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(pVVar3,(int)vPath);
        uVar2 = Abc_ObjLevel(pAVar4);
        printf("Level %3d : ",(ulong)uVar2);
        iVar1 = Abc_ObjIsCi(pAVar4);
        if (iVar1 == 0) {
          iVar1 = Abc_ObjIsCo(pAVar4);
          if (iVar1 == 0) {
            iVar1 = Abc_ObjIsNode(pAVar4);
            if (iVar1 == 0) {
              __assert_fail("Abc_ObjIsNode(pNode)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcTiming.c"
                            ,0x43c,
                            "float Abc_NtkDelayTrace(Abc_Ntk_t *, Abc_Obj_t *, Abc_Obj_t *, int)");
            }
            pAVar6 = (Abc_Obj_t *)Vec_PtrEntry(pVVar3,(int)vPath + -1);
            iVar1 = Abc_NodeFindFanin(pAVar4,pAVar6);
            Abc_NtkDelayTraceSlack((Vec_Int_t *)pNode,pAVar4,iVar1);
            pcVar7 = Abc_ObjName(pAVar4);
            printf("%10s/",pcVar7);
            pcVar7 = Mio_GateReadPinName((Mio_Gate_t *)(pAVar4->field_5).pData,iVar1);
            printf("%-4s",pcVar7);
            pcVar7 = Mio_GateReadName((Mio_Gate_t *)(pAVar4->field_5).pData);
            printf(" (%s)",pcVar7);
            pcVar7 = Mio_GateReadName((Mio_Gate_t *)(pAVar4->field_5).pData);
            sVar9 = strlen(pcVar7);
            for (Length = (int)sVar9; Length < pFanin._4_4_; Length = Length + 1) {
              printf(" ");
            }
            printf("   ");
            fVar12 = Abc_NodeReadArrivalWorst(pAVar4);
            printf("Arrival =%6.1f.   ",(double)fVar12);
            printf("I/O times: (");
            for (Length = 0; iVar1 = Abc_ObjFaninNum(pAVar4), Length < iVar1; Length = Length + 1) {
              pAVar6 = Abc_ObjFanin(pAVar4,Length);
              pcVar7 = "";
              if (Length != 0) {
                pcVar7 = ", ";
              }
              fVar12 = Abc_NodeReadArrivalWorst(pAVar6);
              printf("%s%.1f",(double)fVar12,pcVar7);
            }
            fVar12 = Abc_NodeReadArrivalWorst(pAVar4);
            printf(" -> %.1f)",(double)fVar12);
          }
          else {
            pcVar7 = Abc_ObjName(pAVar4);
            printf("Primary output \"%s\".   ",pcVar7);
            fVar12 = Abc_NodeReadArrivalWorst(pAVar4);
            printf("Arrival =%6.1f. ",(double)fVar12);
          }
          printf("\n");
        }
        else {
          pcVar7 = Abc_ObjName(pAVar4);
          printf("Primary input \"%s\".   ",pcVar7);
          fVar12 = Abc_NodeReadArrivalWorst(pAVar4);
          printf("Arrival time =%6.1f. ",(double)fVar12);
          printf("\n");
        }
      }
      pAVar4 = Abc_ObjFanin0(pIn_local);
      iVar1 = Abc_ObjLevel(pAVar4);
      printf("Level %3d : ",(ulong)(iVar1 + 1));
      pcVar7 = Abc_ObjName(pIn_local);
      printf("Primary output \"%s\".   ",pcVar7);
      fVar12 = Abc_NodeReadRequiredWorst(pIn_local);
      printf("Required time = %6.1f.  ",(double)fVar12);
      printf("Path slack = %6.1f.\n",(double)(fVar10 - fVar11));
    }
    Vec_PtrFree(pVVar3);
    Vec_IntFree(vBest_00);
  }
  Vec_IntFreeP((Vec_Int_t **)&pNode);
  return vPath._4_4_;
}

Assistant:

float Abc_NtkDelayTrace( Abc_Ntk_t * pNtk, Abc_Obj_t * pOut, Abc_Obj_t * pIn, int fPrint )
{
    Vec_Int_t * vSlacks = NULL;
    Abc_Obj_t * pNode, * pDriver;
    Vec_Ptr_t * vNodes;
    Abc_Time_t * pTime;
    float tArrivalMax;
    int i;

    assert( Abc_NtkIsMappedLogic(pNtk) );
    assert( pOut == NULL || Abc_ObjIsCo(pOut) );
    assert( pIn == NULL || Abc_ObjIsCi(pIn) );

    // create slacks (need slacks if printing is requested even if pIn/pOut are not given)
    if ( pOut || pIn || fPrint )
        vSlacks = Abc_NtkDelayTraceSlackStart( pNtk );

    // compute the timing
    Abc_NtkTimePrepare( pNtk );
    vNodes = Abc_NtkDfs( pNtk, 1 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
        Abc_NodeDelayTraceArrival( pNode, vSlacks );
    Vec_PtrFree( vNodes );

    // get the latest arrival times
    tArrivalMax = -ABC_INFINITY;
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        pDriver = Abc_ObjFanin0(pNode);
        pTime   = Abc_NodeArrival(pDriver);
        if ( tArrivalMax < Abc_MaxFloat(pTime->Fall, pTime->Rise) )
            tArrivalMax = Abc_MaxFloat(pTime->Fall, pTime->Rise);
    }

    // determine the output to print
    if ( fPrint && pOut == NULL )
    {
        Abc_NtkForEachCo( pNtk, pNode, i )
        {
            pDriver = Abc_ObjFanin0(pNode);
            pTime   = Abc_NodeArrival(pDriver);
            if ( tArrivalMax == Abc_MaxFloat(pTime->Fall, pTime->Rise) )
                pOut = pNode;
        }
        assert( pOut != NULL );
    }

    if ( fPrint )
    {
        Vec_Ptr_t * vPath = Vec_PtrAlloc( 100 );
        Vec_Int_t * vBest = Vec_IntStartFull( Abc_NtkObjNumMax(pNtk) );
        // traverse to determine the critical path
        Abc_NtkIncrementTravId( pNtk );
        if ( !Abc_NtkDelayTraceCritPath_rec( vSlacks, Abc_ObjFanin0(pOut), pIn, vBest ) )
        {
            if ( pIn == NULL )
                printf( "The logic cone of PO \"%s\" has no primary inputs.\n", Abc_ObjName(pOut) );
            else
                printf( "There is no combinational path between PI \"%s\" and PO \"%s\".\n", Abc_ObjName(pIn), Abc_ObjName(pOut) );
        }
        else
        {
            float Slack = 0.0, SlackAdd;
            int k, iFanin, Length = 0;
            Abc_Obj_t * pFanin;
            // check the additional slack
            SlackAdd = Abc_NodeReadRequiredWorst(pOut) - Abc_NodeReadArrivalWorst(Abc_ObjFanin0(pOut));
            // collect the critical path
            Abc_NtkDelayTraceCritPathCollect_rec( vSlacks, Abc_ObjFanin0(pOut), vBest, vPath );
            if ( pIn == NULL )
                pIn = (Abc_Obj_t *)Vec_PtrEntry( vPath, 0 );
            // find the longest gate name
            Vec_PtrForEachEntry( Abc_Obj_t *, vPath, pNode, i )
                if ( Abc_ObjIsNode(pNode) )
                    Length = Abc_MaxInt( Length, strlen(Mio_GateReadName((Mio_Gate_t *)pNode->pData)) );
            // print critical path
            Abc_NtkLevel( pNtk );
            printf( "Critical path from PI \"%s\" to PO \"%s\":\n", Abc_ObjName(pIn), Abc_ObjName(pOut) ); 
            Vec_PtrForEachEntry( Abc_Obj_t *, vPath, pNode, i )
            {
                printf( "Level %3d : ", Abc_ObjLevel(pNode) );
                if ( Abc_ObjIsCi(pNode) )
                {
                    printf( "Primary input \"%s\".   ", Abc_ObjName(pNode) );
                    printf( "Arrival time =%6.1f. ", Abc_NodeReadArrivalWorst(pNode) );
                    printf( "\n" );
                    continue;
                }
                if ( Abc_ObjIsCo(pNode) )
                {
                    printf( "Primary output \"%s\".   ", Abc_ObjName(pNode) );
                    printf( "Arrival =%6.1f. ", Abc_NodeReadArrivalWorst(pNode) );
                }
                else
                {
                    assert( Abc_ObjIsNode(pNode) );
                    iFanin = Abc_NodeFindFanin( pNode, (Abc_Obj_t *)Vec_PtrEntry(vPath,i-1) );
                    Slack = Abc_NtkDelayTraceSlack(vSlacks, pNode, iFanin);
                    printf( "%10s/", Abc_ObjName(pNode) );
                    printf( "%-4s", Mio_GateReadPinName((Mio_Gate_t *)pNode->pData, iFanin) );
                    printf( " (%s)", Mio_GateReadName((Mio_Gate_t *)pNode->pData) );
                    for ( k = strlen(Mio_GateReadName((Mio_Gate_t *)pNode->pData)); k < Length; k++ )
                        printf( " " );
                    printf( "   " );
                    printf( "Arrival =%6.1f.   ", Abc_NodeReadArrivalWorst(pNode) );
                    printf( "I/O times: (" );
                    Abc_ObjForEachFanin( pNode, pFanin, k )
                        printf( "%s%.1f", (k? ", ":""), Abc_NodeReadArrivalWorst(pFanin) );
//                    printf( " -> %.1f)", Abc_NodeReadArrival(pNode)->Worst + Slack + SlackAdd );
                    printf( " -> %.1f)", Abc_NodeReadArrivalWorst(pNode) );
                }
                printf( "\n" );
            }
            printf( "Level %3d : ", Abc_ObjLevel(Abc_ObjFanin0(pOut)) + 1 );
            printf( "Primary output \"%s\".   ", Abc_ObjName(pOut) );
            printf( "Required time = %6.1f.  ", Abc_NodeReadRequiredWorst(pOut) );
            printf( "Path slack = %6.1f.\n", SlackAdd );
        }
        Vec_PtrFree( vPath );
        Vec_IntFree( vBest );
    }

    Vec_IntFreeP( &vSlacks );
    return tArrivalMax;
}